

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnitIndex.cpp
# Opt level: O2

Entry * __thiscall llvm::DWARFUnitIndex::getFromHash(DWARFUnitIndex *this,uint64_t S)

{
  Entry *pEVar1;
  uint64_t uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = (uint)S;
  uVar3 = (this->Header).NumBuckets - 1;
  pEVar1 = (this->Rows)._M_t.
           super___uniq_ptr_impl<llvm::DWARFUnitIndex::Entry,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_llvm::DWARFUnitIndex::Entry_*,_std::default_delete<llvm::DWARFUnitIndex::Entry[]>_>
           .super__Head_base<0UL,_llvm::DWARFUnitIndex::Entry_*,_false>._M_head_impl;
  while( true ) {
    uVar4 = uVar4 & uVar3;
    uVar2 = pEVar1[uVar4].Signature;
    if (uVar2 == S) {
      return pEVar1 + uVar4;
    }
    if (uVar2 == 0) break;
    uVar4 = uVar4 + ((uint)(S >> 0x20) & uVar3 | 1);
  }
  return (Entry *)0x0;
}

Assistant:

const DWARFUnitIndex::Entry *DWARFUnitIndex::getFromHash(uint64_t S) const {
  uint64_t Mask = Header.NumBuckets - 1;

  auto H = S & Mask;
  auto HP = ((S >> 32) & Mask) | 1;
  while (Rows[H].getSignature() != S && Rows[H].getSignature() != 0)
    H = (H + HP) & Mask;

  if (Rows[H].getSignature() != S)
    return nullptr;

  return &Rows[H];
}